

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_32x8_avx2
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  longlong lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  byte bVar12;
  int iVar13;
  longlong *plVar14;
  long lVar15;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int i_1;
  __m128i d [16];
  __m128i dstvec [32];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  __m128i *in_stack_fffffffffffff4b0;
  __m128i *in_stack_fffffffffffff4b8;
  __m128i *x0;
  int local_a84;
  longlong local_a80 [32];
  undefined8 local_980 [12];
  longlong alStack_920 [54];
  long local_770;
  long local_768;
  __m128i *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  int in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8ec;
  undefined1 in_stack_fffffffffffff8f0 [16];
  undefined1 in_stack_fffffffffffff900 [16];
  __m128i *in_stack_fffffffffffff910;
  __m128i *in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff920 [32];
  undefined1 in_stack_fffffffffffff940 [32];
  undefined1 in_stack_fffffffffffff960 [32];
  int local_678;
  uint local_674;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_a0;
  undefined8 uStack_98;
  
  bVar12 = (byte)in_ECX;
  iVar13 = 0x27 << (bVar12 & 0x1f);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar3 = vpinsrw_avx(auVar2,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  uStack_450 = auVar2._0_8_;
  uStack_448 = auVar2._8_8_;
  bVar1 = *(byte *)(in_RDX + iVar13);
  auVar2 = vpinsrb_avx(ZEXT116(bVar1),(uint)bVar1,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xe);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xf);
  local_a0 = auVar2._0_8_;
  uStack_98 = auVar2._8_8_;
  auVar17 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar17 = vpinsrw_avx(auVar17,0x3f,2);
  auVar17 = vpinsrw_avx(auVar17,0x3f,3);
  auVar17 = vpinsrw_avx(auVar17,0x3f,4);
  auVar17 = vpinsrw_avx(auVar17,0x3f,5);
  auVar17 = vpinsrw_avx(auVar17,0x3f,6);
  auVar17 = vpinsrw_avx(auVar17,0x3f,7);
  auVar16 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar16 = vpinsrw_avx(auVar16,0x3f,2);
  auVar16 = vpinsrw_avx(auVar16,0x3f,3);
  auVar16 = vpinsrw_avx(auVar16,0x3f,4);
  auVar16 = vpinsrw_avx(auVar16,0x3f,5);
  auVar16 = vpinsrw_avx(auVar16,0x3f,6);
  auVar16 = vpinsrw_avx(auVar16,0x3f,7);
  auVar16 = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar16;
  auVar17 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
  uStack_410 = auVar17._0_8_;
  uStack_408 = auVar17._8_8_;
  local_678 = 0;
  local_674 = in_R8D;
  while( true ) {
    if (0x1f < local_678) break;
    in_stack_fffffffffffff8ec = (int)local_674 >> (6 - bVar12 & 0x1f);
    in_stack_fffffffffffff8e8 = iVar13 - in_stack_fffffffffffff8ec >> (bVar12 & 0x1f);
    if (in_stack_fffffffffffff8e8 < 1) goto LAB_005d1ff0;
    if (8 < in_stack_fffffffffffff8e8) {
      in_stack_fffffffffffff8e8 = 8;
    }
    in_stack_fffffffffffff900 = *(undefined1 (*) [16])(in_RDX + in_stack_fffffffffffff8ec);
    in_stack_fffffffffffff8f0 = *(undefined1 (*) [16])(in_RDX + in_stack_fffffffffffff8ec + 1);
    if (in_ECX == 0) {
      auVar17 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,2);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,3);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,4);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,5);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,6);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,7);
      auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
      uStack_390 = auVar18._0_8_;
      uStack_388 = auVar18._8_8_;
      auVar5._16_8_ = uStack_390;
      auVar5._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar4;
      auVar5._24_8_ = uStack_388;
      auVar6._16_8_ = uStack_410;
      auVar6._0_16_ = auVar16;
      auVar6._24_8_ = uStack_408;
      auVar6 = vpand_avx2(auVar5,auVar6);
      in_stack_fffffffffffff920 = vpsrlw_avx2(auVar6,ZEXT416(1));
    }
    else {
      auVar17._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar17._0_8_ = EvenOddMaskx[0]._0_8_;
      in_stack_fffffffffffff900 =
           vpshufb_avx(*(undefined1 (*) [16])(in_RDX + in_stack_fffffffffffff8ec),auVar17);
      in_stack_fffffffffffff8f0 = vpsrldq_avx(in_stack_fffffffffffff900,8);
      auVar17 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,2);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,3);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,4);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,5);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,6);
      auVar17 = vpinsrw_avx(auVar17,local_674 & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,7);
      auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
      uStack_3d0 = auVar18._0_8_;
      uStack_3c8 = auVar18._8_8_;
      auVar11._16_8_ = uStack_3d0;
      auVar11._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar4;
      auVar11._24_8_ = uStack_3c8;
      auVar6 = vpsllw_avx2(auVar11,ZEXT416(in_ECX));
      auVar10._16_8_ = uStack_410;
      auVar10._0_16_ = auVar16;
      auVar10._24_8_ = uStack_408;
      auVar6 = vpand_avx2(auVar6,auVar10);
      in_stack_fffffffffffff920 = vpsrlw_avx2(auVar6,ZEXT416(1));
    }
    auVar6 = vpmovzxbw_avx2(in_stack_fffffffffffff900);
    auVar5 = vpmovzxbw_avx2(in_stack_fffffffffffff8f0);
    auVar5 = vpsubw_avx2(auVar5,auVar6);
    auVar6 = vpsllw_avx2(auVar6,ZEXT416(5));
    auVar8._16_8_ = uStack_450;
    auVar8._0_16_ = auVar3;
    auVar8._24_8_ = uStack_448;
    auVar6 = vpaddw_avx2(auVar6,auVar8);
    in_stack_fffffffffffff960 = vpmullw_avx2(auVar5,in_stack_fffffffffffff920);
    auVar6 = vpaddw_avx2(auVar6,in_stack_fffffffffffff960);
    auVar6 = vpsrlw_avx2(auVar6,ZEXT416(5));
    auVar9._16_16_ = ZEXT416(5);
    auVar9._0_16_ = auVar6._16_16_;
    in_stack_fffffffffffff940 = vpackuswb_avx2(auVar6,auVar9);
    in_stack_fffffffffffff910 = in_stack_fffffffffffff940._0_8_;
    in_stack_fffffffffffff918 = in_stack_fffffffffffff940._8_8_;
    auVar17 = vpblendvb_avx(auVar2,in_stack_fffffffffffff940._0_16_,
                            *(undefined1 (*) [16])BaseMask[in_stack_fffffffffffff8e8]);
    *(undefined1 (*) [16])(local_980 + (long)local_678 * 2) = auVar17;
    local_674 = in_R8D + local_674;
    local_678 = local_678 + 1;
  }
LAB_005d2830:
  x0 = (__m128i *)alStack_920;
  local_770 = in_RSI;
  local_768 = in_RDI;
  transpose16x8_8x16_sse2
            (x0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,(__m128i *)(local_a80 + 0xe),
             (__m128i *)(local_a80 + 0xc),(__m128i *)(local_a80 + 10),in_stack_fffffffffffff8d8,
             (__m128i *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             (__m128i *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
             in_stack_fffffffffffff8f0._0_8_,in_stack_fffffffffffff8f0._8_8_,
             in_stack_fffffffffffff900._0_8_,in_stack_fffffffffffff900._8_8_,
             in_stack_fffffffffffff910,in_stack_fffffffffffff918,in_stack_fffffffffffff920._0_8_,
             in_stack_fffffffffffff920._8_8_,in_stack_fffffffffffff920._16_8_,
             in_stack_fffffffffffff920._24_8_,in_stack_fffffffffffff940._0_8_,
             in_stack_fffffffffffff940._8_8_,in_stack_fffffffffffff940._16_8_,
             in_stack_fffffffffffff940._24_8_,in_stack_fffffffffffff960._0_8_);
  transpose16x8_8x16_sse2
            (x0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,(__m128i *)(local_a80 + 0x1e),
             (__m128i *)(local_a80 + 0x1c),(__m128i *)(local_a80 + 0x1a),in_stack_fffffffffffff8d8,
             (__m128i *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             (__m128i *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
             in_stack_fffffffffffff8f0._0_8_,in_stack_fffffffffffff8f0._8_8_,
             in_stack_fffffffffffff900._0_8_,in_stack_fffffffffffff900._8_8_,
             in_stack_fffffffffffff910,in_stack_fffffffffffff918,in_stack_fffffffffffff920._0_8_,
             in_stack_fffffffffffff920._8_8_,in_stack_fffffffffffff920._16_8_,
             in_stack_fffffffffffff920._24_8_,in_stack_fffffffffffff940._0_8_,
             in_stack_fffffffffffff940._8_8_,in_stack_fffffffffffff940._16_8_,
             in_stack_fffffffffffff940._24_8_,in_stack_fffffffffffff960._0_8_);
  for (local_a84 = 0; local_a84 < 8; local_a84 = local_a84 + 1) {
    plVar14 = (longlong *)(local_768 + local_a84 * local_770);
    lVar7 = local_a80[(long)local_a84 * 2 + 1];
    *plVar14 = local_a80[(long)local_a84 * 2];
    plVar14[1] = lVar7;
    lVar15 = local_768 + local_a84 * local_770;
    lVar7 = local_a80[(long)(local_a84 + 8) * 2 + 1];
    *(longlong *)(lVar15 + 0x10) = local_a80[(long)(local_a84 + 8) * 2];
    *(longlong *)(lVar15 + 0x18) = lVar7;
  }
  return;
LAB_005d1ff0:
  for (; in_stack_fffffffffffff8e4 = local_678, local_678 < 0x20; local_678 = local_678 + 1) {
    local_980[(long)local_678 * 2] = local_a0;
    local_980[(long)local_678 * 2 + 1] = uStack_98;
  }
  goto LAB_005d2830;
}

Assistant:

static void dr_prediction_z3_32x8_avx2(uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *left, int upsample_left,
                                       int dy) {
  __m128i dstvec[32], d[16];

  dr_prediction_z1_HxW_internal_avx2(8, 32, dstvec, left, upsample_left, dy);

  transpose16x8_8x16_sse2(
      &dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3], &dstvec[4], &dstvec[5],
      &dstvec[6], &dstvec[7], &dstvec[8], &dstvec[9], &dstvec[10], &dstvec[11],
      &dstvec[12], &dstvec[13], &dstvec[14], &dstvec[15], &d[0], &d[1], &d[2],
      &d[3], &d[4], &d[5], &d[6], &d[7]);
  transpose16x8_8x16_sse2(
      &dstvec[0 + 16], &dstvec[1 + 16], &dstvec[2 + 16], &dstvec[3 + 16],
      &dstvec[4 + 16], &dstvec[5 + 16], &dstvec[6 + 16], &dstvec[7 + 16],
      &dstvec[8 + 16], &dstvec[9 + 16], &dstvec[10 + 16], &dstvec[11 + 16],
      &dstvec[12 + 16], &dstvec[13 + 16], &dstvec[14 + 16], &dstvec[15 + 16],
      &d[0 + 8], &d[1 + 8], &d[2 + 8], &d[3 + 8], &d[4 + 8], &d[5 + 8],
      &d[6 + 8], &d[7 + 8]);

  for (int i = 0; i < 8; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride), d[i]);
    _mm_storeu_si128((__m128i *)(dst + i * stride + 16), d[i + 8]);
  }
}